

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

void RigidBodyDynamics::CalcConstrainedSystemVariables
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,ConstraintSet *CS,
               bool update_kinematics,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  element_type *peVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long in_R8;
  byte in_R9B;
  uint i;
  Vector3d gamma_i;
  Vector3d prev_body_point;
  uint prev_body_id;
  VectorNd *in_stack_000003c8;
  VectorNd *in_stack_000003d0;
  VectorNd *in_stack_000003d8;
  Model *in_stack_000003e0;
  vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *in_stack_00000490;
  VectorNd *in_stack_00000498;
  VectorNd *in_stack_000004a0;
  VectorNd *in_stack_000004a8;
  Model *in_stack_000004b0;
  undefined1 in_stack_00000dbf;
  MatrixNd *in_stack_00000dc0;
  VectorNd *in_stack_00000dc8;
  Model *in_stack_00000dd0;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  ConstraintSet *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint uVar5;
  Model *in_stack_ffffffffffffff80;
  VectorNd *in_stack_ffffffffffffff88;
  Model *in_stack_ffffffffffffff90;
  VectorNd *in_stack_ffffffffffffff98;
  Constraint *in_stack_ffffffffffffffa0;
  
  if ((in_R9B & 1) != 0) {
    UpdateKinematicsCustom(in_stack_000003e0,in_stack_000003d8,in_stack_000003d0,in_stack_000003c8);
  }
  NonlinearEffects(in_stack_000004b0,in_stack_000004a8,in_stack_000004a0,in_stack_00000498,
                   in_stack_00000490);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  CompositeRigidBodyAlgorithm
            (in_stack_00000dd0,in_stack_00000dc8,in_stack_00000dc0,(bool)in_stack_00000dbf);
  CalcConstraintsJacobian
            (in_stack_ffffffffffffff80,
             (VectorNd *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70,
             (MatrixNd *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
             SUB41((uint)in_stack_ffffffffffffff64 >> 0x18,0));
  CalcConstraintsPositionError
            (in_stack_ffffffffffffff80,
             (VectorNd *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70,
             (VectorNd *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
             SUB41((uint)in_stack_ffffffffffffff64 >> 0x18,0));
  CalcConstraintsVelocityError
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (VectorNd *)in_stack_ffffffffffffff80,
             (ConstraintSet *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (VectorNd *)in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Vector3_t::
  Vector3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Vector3_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Vector3_t::
  Vector3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Vector3_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  UpdateKinematicsCustom(in_stack_000003e0,in_stack_000003d8,in_stack_000003d0,in_stack_000003c8);
  uVar5 = 0;
  while( true ) {
    uVar2 = (ulong)uVar5;
    sVar3 = std::
            vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
            ::size((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                    *)(in_R8 + 200));
    if (sVar3 <= uVar2) break;
    std::
    vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
    ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                  *)(in_R8 + 200),(ulong)uVar5);
    peVar4 = std::
             __shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x6d88df);
    (*peVar4->_vptr_Constraint[2])
              (0,peVar4,in_RDI,in_RSI,in_RDX,in_R8 + 0x198,in_R8 + 0x188,in_R8 + 0x620,0);
    std::
    vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
    ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                  *)(in_R8 + 200),(ulong)uVar5);
    peVar4 = std::
             __shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x6d8961);
    bVar1 = Constraint::isBaumgarteStabilizationEnabled(peVar4);
    if (bVar1) {
      std::
      vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
      ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                    *)(in_R8 + 200),(ulong)uVar5);
      std::
      __shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x6d8991);
      Constraint::addInBaumgarteStabilizationForces
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (VectorNd *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

RBDL_DLLAPI
void CalcConstrainedSystemVariables (
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  const Math::VectorNd &Tau,
  ConstraintSet &CS,
  bool update_kinematics,
  std::vector<Math::SpatialVector> *f_ext
)
{
  // Compute G
  if(update_kinematics){
    UpdateKinematicsCustom(model, &Q, NULL, NULL);
  }

  // Compute C
  NonlinearEffects(model, Q, QDot, CS.C, f_ext);
  assert(CS.H.cols() == model.dof_count && CS.H.rows() == model.dof_count);

  // Compute H
  CS.H.setZero();
  CompositeRigidBodyAlgorithm(model, Q, CS.H, false);

  CalcConstraintsJacobian (model, Q, CS, CS.G, false);

  // Compute position error for Baumgarte Stabilization.
  CalcConstraintsPositionError (model, Q, CS, CS.err, false);

  // Compute velocity error for Baugarte stabilization.
  CalcConstraintsVelocityError (model, Q, QDot, CS, CS.errd, false);
  //CS.errd = CS.G * QDot;

  // Compute gamma
  unsigned int prev_body_id = 0;
  Vector3d prev_body_point = Vector3d::Zero();
  Vector3d gamma_i = Vector3d::Zero();

  CS.QDDot_0.setZero();
  UpdateKinematicsCustom(model, NULL, NULL, &CS.QDDot_0);


  for(unsigned int i=0; i<CS.constraints.size(); ++i) {
    CS.constraints[i]->calcGamma(model,0,Q,QDot,CS.G,CS.gamma,CS.cache);
    if(CS.constraints[i]->isBaumgarteStabilizationEnabled()) {
      CS.constraints[i]->addInBaumgarteStabilizationForces(
        CS.err,CS.errd,CS.gamma);
    }
  }


}